

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::TestCaseTracking::SectionTracker::~SectionTracker(SectionTracker *this)

{
  SectionTracker *this_local;
  
  ~SectionTracker(this);
  operator_delete(this,0x60);
  return;
}

Assistant:

TrackerBase::~TrackerBase() {}